

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

void __thiscall Catch::TestCase::TestCase(TestCase *this,ITestInvoker *testCase,TestCaseInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  pointer pbVar5;
  size_t sVar6;
  
  paVar1 = &(this->super_TestCaseInfo).name.field_2;
  (this->super_TestCaseInfo).name._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (info->name)._M_dataplus._M_p;
  paVar2 = &(info->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(info->name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->super_TestCaseInfo).name.field_2 + 8) = uVar4;
  }
  else {
    (this->super_TestCaseInfo).name._M_dataplus._M_p = pcVar3;
    (this->super_TestCaseInfo).name.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->super_TestCaseInfo).name._M_string_length = (info->name)._M_string_length;
  (info->name)._M_dataplus._M_p = (pointer)paVar2;
  (info->name)._M_string_length = 0;
  (info->name).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->super_TestCaseInfo).className.field_2;
  (this->super_TestCaseInfo).className._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (info->className)._M_dataplus._M_p;
  paVar2 = &(info->className).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(info->className).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->super_TestCaseInfo).className.field_2 + 8) = uVar4;
  }
  else {
    (this->super_TestCaseInfo).className._M_dataplus._M_p = pcVar3;
    (this->super_TestCaseInfo).className.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
  }
  (this->super_TestCaseInfo).className._M_string_length = (info->className)._M_string_length;
  (info->className)._M_dataplus._M_p = (pointer)paVar2;
  (info->className)._M_string_length = 0;
  (info->className).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->super_TestCaseInfo).description.field_2;
  (this->super_TestCaseInfo).description._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (info->description)._M_dataplus._M_p;
  paVar2 = &(info->description).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(info->description).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->super_TestCaseInfo).description.field_2 + 8) = uVar4;
  }
  else {
    (this->super_TestCaseInfo).description._M_dataplus._M_p = pcVar3;
    (this->super_TestCaseInfo).description.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
  }
  (this->super_TestCaseInfo).description._M_string_length = (info->description)._M_string_length;
  (info->description)._M_dataplus._M_p = (pointer)paVar2;
  (info->description)._M_string_length = 0;
  (info->description).field_2._M_local_buf[0] = '\0';
  pbVar5 = (info->tags).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_TestCaseInfo).tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (info->tags).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_TestCaseInfo).tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  (this->super_TestCaseInfo).tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (info->tags).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (info->tags).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (info->tags).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (info->tags).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar5 = (info->lcaseTags).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_TestCaseInfo).lcaseTags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (info->lcaseTags).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_TestCaseInfo).lcaseTags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  (this->super_TestCaseInfo).lcaseTags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (info->lcaseTags).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (info->lcaseTags).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (info->lcaseTags).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (info->lcaseTags).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TestCaseInfo).properties = info->properties;
  sVar6 = (info->lineInfo).line;
  (this->super_TestCaseInfo).lineInfo.file = (info->lineInfo).file;
  (this->super_TestCaseInfo).lineInfo.line = sVar6;
  (this->test).super___shared_ptr<Catch::ITestInvoker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = testCase
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Catch::ITestInvoker*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->test).super___shared_ptr<Catch::ITestInvoker,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,testCase);
  return;
}

Assistant:

TestCase::TestCase( ITestInvoker* testCase, TestCaseInfo&& info ) : TestCaseInfo( std::move(info) ), test( testCase ) {}